

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPServer.cpp
# Opt level: O0

void __thiscall SocketPP::TCPServer::startSendThread(TCPServer *this)

{
  thread *this_00;
  type local_18;
  TCPServer *local_10;
  TCPServer *this_local;
  
  local_10 = this;
  this_00 = (thread *)operator_new(8);
  local_18.this = this;
  std::thread::thread<SocketPP::TCPServer::startSendThread()::__0,,void>(this_00,&local_18);
  this->sendThread_ = this_00;
  return;
}

Assistant:

void TCPServer::startSendThread() {
    sendThread_ = new std::thread([this] {
        LOGD("sendThread running...");
        Message msg;

        while (true) {
            {
                std::unique_lock<std::mutex> lock(msgQueueMutex_);
                LOGD("msgQueue_.size=%ld, msgQueueCondition_ will %s", msgQueue_.size(),
                     msgQueue_.empty() ? "waiting..." : "not wait!");
                msgQueueCondition_.wait(lock, [this] { return !msgQueue_.empty() || stopped_; });
                LOGD("msgQueueCondition_ wake! msgQueue_.size=%ld", msgQueue_.size());

                if (stopped_) return;

                msg = msgQueue_.front();
                msgQueue_.pop();
            }

            send(msg);
        }
    });
}